

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadCellIsThreeState(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Scl_Item_t *pSVar6;
  Scl_Item_t *pSVar7;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if ((int)uVar1 < 0) {
      pSVar6 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar6 = p->pItems + uVar1;
    }
    if (pSVar6 != (Scl_Item_t *)0x0) {
      pcVar3 = p->pContents;
      do {
        iVar5 = (pSVar6->Key).Beg;
        iVar4 = (pSVar6->Key).End - iVar5;
        iVar5 = strncmp(pcVar3 + iVar5,"pin",(long)iVar4);
        if (iVar4 == 3 && iVar5 == 0) {
          uVar1 = pSVar6->Child;
          while( true ) {
            if (iVar2 <= (int)uVar1) goto LAB_003e47c1;
            if ((int)uVar1 < 0) {
              pSVar7 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar7 = p->pItems + uVar1;
            }
            if (pSVar7 == (Scl_Item_t *)0x0) break;
            iVar5 = (pSVar7->Key).Beg;
            iVar4 = (pSVar7->Key).End - iVar5;
            iVar5 = strncmp(pcVar3 + iVar5,"three_state",(long)iVar4);
            if (iVar4 == 0xb && iVar5 == 0) {
              return 1;
            }
            uVar1 = pSVar7->Next;
          }
        }
        uVar1 = pSVar6->Next;
        if (iVar2 <= (int)uVar1) goto LAB_003e47c1;
        if ((int)uVar1 < 0) {
          pSVar6 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar6 = p->pItems + uVar1;
        }
      } while (pSVar6 != (Scl_Item_t *)0x0);
    }
    return 0;
  }
LAB_003e47c1:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadCellIsThreeState( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin, * pItem;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        Scl_ItemForEachChildName( p, pPin, pItem, "three_state" )
            return 1;
    return 0;
}